

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Query.cpp
# Opt level: O3

vector<Query,_std::allocator<Query>_> * __thiscall Query::as_queries(Query *this)

{
  runtime_error *this_00;
  
  if (this->type - AND < 3) {
    return &this->queries;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"This query doesn\'t contain subqueries.");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

std::vector<Query> &Query::as_queries() {
    if (type != QueryType::AND && type != QueryType::OR &&
        type != QueryType::MIN_OF) {
        throw std::runtime_error("This query doesn\'t contain subqueries.");
    }
    return queries;
}